

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

bool __thiscall QCss::Parser::parsePrio(Parser *this,Declaration *declaration)

{
  undefined1 *puVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  Symbol *pSVar6;
  
  puVar1 = &((declaration->d).d.ptr)->field_0x60;
  *puVar1 = *puVar1 | 1;
  lVar2 = (this->symbols).d.size;
  iVar4 = this->index;
  lVar5 = (long)iVar4;
  lVar3 = lVar2 - lVar5;
  if (lVar3 != 0 && lVar5 <= lVar2) {
    pSVar6 = (this->symbols).d.ptr + lVar5;
    do {
      iVar4 = iVar4 + 1;
      if (pSVar6->token != S) {
        return true;
      }
      this->index = iVar4;
      pSVar6 = pSVar6 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return true;
}

Assistant:

constexpr P get() const noexcept { return ptr; }